

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,long,std::unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  UnifiedVectorFormat sdata;
  long *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  uVar5 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    iVar6 = 0;
    do {
      iVar7 = iVar6;
      if (*local_68 != 0) {
        iVar7 = (idx_t)*(uint *)(*local_68 + iVar6 * 4);
      }
      lVar2 = **(long **)(local_60 + iVar7 * 8);
      if (lVar2 != 0) {
        lVar8 = lVar8 + *(long *)(lVar2 + 0x18);
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  duckdb::ListVector::Reserve(result,lVar8 + uVar5);
  lVar8 = duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    lVar2 = *(long *)(result + 0x20);
    lVar3 = *local_68;
    lVar8 = *(long *)(lVar8 + 0x20);
    iVar6 = 0;
    do {
      iVar7 = iVar6;
      if (lVar3 != 0) {
        iVar7 = (idx_t)*(uint *)(lVar3 + iVar6 * 4);
      }
      plVar4 = *(long **)(local_60 + iVar7 * 8);
      plVar1 = (long *)(lVar2 + iVar6 * 0x10);
      *(ulong *)(lVar2 + iVar6 * 0x10) = uVar5;
      lVar10 = *plVar4;
      if (lVar10 == 0) {
        lVar10 = 0;
      }
      else {
        for (puVar9 = *(undefined8 **)(lVar10 + 0x10); puVar9 != (undefined8 *)0x0;
            puVar9 = (undefined8 *)*puVar9) {
          *(undefined8 *)(lVar8 + uVar5 * 8) = puVar9[1];
          uVar5 = uVar5 + 1;
        }
        lVar10 = uVar5 - *plVar1;
      }
      plVar1[1] = lVar10;
      iVar6 = iVar6 + 1;
    } while (iVar6 != count);
  }
  duckdb::ListVector::SetListSize(result,uVar5);
  duckdb::Vector::Verify((ulong)result);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}